

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  ulong uVar3;
  char cVar4;
  unsigned_long_long uVar5;
  BYTE *ipstart;
  void *src_00;
  long lVar6;
  size_t sVar7;
  ZSTD_frameSizeInfo ZVar8;
  blockProperties_t blockProperties;
  ZSTD_frameHeader zfh;
  blockProperties_t local_64;
  ZSTD_frameHeader local_58;
  
  if ((srcSize < 8) || ((*src & 0xfffffff0) != 0x184d2a50)) {
    sVar1 = ZSTD_getFrameHeader_advanced(&local_58,src,srcSize,ZSTD_f_zstd1);
    sVar7 = 0xffffffffffffffb8;
    if (0xffffffffffffff88 < sVar1) {
      sVar7 = sVar1;
    }
    uVar5 = 0xfffffffffffffffe;
    if (sVar1 == 0) {
      src_00 = (void *)((long)src + (ulong)local_58.headerSize);
      uVar3 = srcSize - local_58.headerSize;
      lVar6 = 0;
      sVar1 = sVar7;
      do {
        sVar7 = ZSTD_getcBlockSize(src_00,uVar3,&local_64);
        cVar4 = '\x01';
        if (sVar7 < 0xffffffffffffff89) {
          uVar2 = sVar7 + 3;
          if (uVar3 < uVar2) {
            sVar7 = 0xffffffffffffffb8;
          }
          else {
            src_00 = (void *)((long)src_00 + uVar2);
            lVar6 = lVar6 + 1;
            cVar4 = (local_64.lastBlock != 0) * '\x03';
            uVar3 = uVar3 - uVar2;
            sVar7 = sVar1;
          }
        }
        sVar1 = sVar7;
      } while (cVar4 == '\0');
      if (cVar4 == '\x03') {
        if (local_58.checksumFlag != 0) {
          sVar7 = 0xffffffffffffffb8;
          uVar5 = 0xfffffffffffffffe;
          if (uVar3 < 4) goto LAB_0023379e;
          src_00 = (void *)((long)src_00 + 4);
        }
        sVar7 = (long)src_00 - (long)src;
        uVar5 = lVar6 * (ulong)local_58.blockSizeMax;
        if (local_58.frameContentSize != 0xffffffffffffffff) {
          uVar5 = local_58.frameContentSize;
        }
      }
      else {
        uVar5 = 0xfffffffffffffffe;
      }
    }
  }
  else if (*(uint *)((long)src + 4) >> 3 < 0x1fffffff) {
    uVar3 = (ulong)*(uint *)((long)src + 4) + 8;
    sVar7 = 0xffffffffffffffb8;
    if (uVar3 <= srcSize) {
      sVar7 = uVar3;
    }
    uVar5 = 0;
  }
  else {
    sVar7 = 0xfffffffffffffff2;
    uVar5 = 0;
  }
LAB_0023379e:
  ZVar8.decompressedBound = uVar5;
  ZVar8.compressedSize = sVar7;
  return ZVar8;
}

Assistant:

static ZSTD_frameSizeInfo ZSTD_findFrameSizeInfo(const void* src, size_t srcSize)
{
    ZSTD_frameSizeInfo frameSizeInfo;
    ZSTD_memset(&frameSizeInfo, 0, sizeof(ZSTD_frameSizeInfo));

#if defined(ZSTD_LEGACY_SUPPORT) && (ZSTD_LEGACY_SUPPORT >= 1)
    if (ZSTD_isLegacy(src, srcSize))
        return ZSTD_findFrameSizeInfoLegacy(src, srcSize);
#endif

    if ((srcSize >= ZSTD_SKIPPABLEHEADERSIZE)
        && (MEM_readLE32(src) & ZSTD_MAGIC_SKIPPABLE_MASK) == ZSTD_MAGIC_SKIPPABLE_START) {
        frameSizeInfo.compressedSize = readSkippableFrameSize(src, srcSize);
        assert(ZSTD_isError(frameSizeInfo.compressedSize) ||
               frameSizeInfo.compressedSize <= srcSize);
        return frameSizeInfo;
    } else {
        const BYTE* ip = (const BYTE*)src;
        const BYTE* const ipstart = ip;
        size_t remainingSize = srcSize;
        size_t nbBlocks = 0;
        ZSTD_frameHeader zfh;

        /* Extract Frame Header */
        {   size_t const ret = ZSTD_getFrameHeader(&zfh, src, srcSize);
            if (ZSTD_isError(ret))
                return ZSTD_errorFrameSizeInfo(ret);
            if (ret > 0)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
        }

        ip += zfh.headerSize;
        remainingSize -= zfh.headerSize;

        /* Iterate over each block */
        while (1) {
            blockProperties_t blockProperties;
            size_t const cBlockSize = ZSTD_getcBlockSize(ip, remainingSize, &blockProperties);
            if (ZSTD_isError(cBlockSize))
                return ZSTD_errorFrameSizeInfo(cBlockSize);

            if (ZSTD_blockHeaderSize + cBlockSize > remainingSize)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));

            ip += ZSTD_blockHeaderSize + cBlockSize;
            remainingSize -= ZSTD_blockHeaderSize + cBlockSize;
            nbBlocks++;

            if (blockProperties.lastBlock) break;
        }

        /* Final frame content checksum */
        if (zfh.checksumFlag) {
            if (remainingSize < 4)
                return ZSTD_errorFrameSizeInfo(ERROR(srcSize_wrong));
            ip += 4;
        }

        frameSizeInfo.compressedSize = (size_t)(ip - ipstart);
        frameSizeInfo.decompressedBound = (zfh.frameContentSize != ZSTD_CONTENTSIZE_UNKNOWN)
                                        ? zfh.frameContentSize
                                        : nbBlocks * zfh.blockSizeMax;
        return frameSizeInfo;
    }
}